

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBCore.c
# Opt level: O2

Vec_Int_t * Bmc_ManBCoreCollectPivots(Gia_Man_t *p,char *pName,Vec_Int_t *vVarMap)

{
  uint v;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Gia_Obj_t *pGVar1;
  int iVar2;
  int iVar3;
  
  p_00 = Vec_IntAlloc((int)p);
  p_01 = Bmc_ManBCoreReadPivots(pName);
  for (iVar2 = 0; iVar2 < p->nObjs; iVar2 = iVar2 + 1) {
    pGVar1 = Gia_ManObj(p,iVar2);
    if (pGVar1 == (Gia_Obj_t *)0x0) break;
    pGVar1->field_0x3 = pGVar1->field_0x3 & 0xbf;
  }
  iVar2 = p_01->nSize;
  if (iVar2 < 1) {
    iVar2 = 0;
  }
  for (iVar3 = 0; iVar2 != iVar3; iVar3 = iVar3 + 1) {
    v = Vec_IntEntry(p_01,iVar3);
    if (((int)v < 1) || (p->nObjs <= (int)v)) {
      printf("Cannot find object with Id %d in the given AIG.\n",(ulong)v);
    }
    else {
      pGVar1 = Gia_ManObj(p,v);
      pGVar1->field_0x3 = pGVar1->field_0x3 | 0x40;
    }
  }
  for (iVar2 = 1; iVar2 < vVarMap->nSize; iVar2 = iVar2 + 2) {
    iVar3 = Vec_IntEntry(vVarMap,iVar2 + -1);
    Vec_IntEntry(vVarMap,iVar2);
    pGVar1 = Gia_ManObj(p,iVar3);
    if ((pGVar1->field_0x3 & 0x40) != 0) {
      iVar3 = Abc_Lit2Var(iVar2 + -1);
      Vec_IntPush(p_00,iVar3);
    }
  }
  for (iVar2 = 0; iVar2 < p->nObjs; iVar2 = iVar2 + 1) {
    pGVar1 = Gia_ManObj(p,iVar2);
    if (pGVar1 == (Gia_Obj_t *)0x0) break;
    pGVar1->field_0x3 = pGVar1->field_0x3 & 0xbf;
  }
  Vec_IntFree(p_01);
  return p_00;
}

Assistant:

Vec_Int_t * Bmc_ManBCoreCollectPivots( Gia_Man_t * p, char * pName, Vec_Int_t * vVarMap )
{
    Gia_Obj_t * pObj;
    int i, iVar, iFrame;
    Vec_Int_t * vPivots = Vec_IntAlloc( 100 );
    Vec_Int_t * vVars = Bmc_ManBCoreReadPivots( pName );
    Gia_ManForEachObj( p, pObj, i )
        pObj->fMark0 = 0;
    Vec_IntForEachEntry( vVars, iVar, i )
        if ( iVar > 0 && iVar < Gia_ManObjNum(p) )
            Gia_ManObj( p, iVar )->fMark0 = 1;
        else
            printf( "Cannot find object with Id %d in the given AIG.\n", iVar );
    Vec_IntForEachEntryDouble( vVarMap, iVar, iFrame, i )
        if ( Gia_ManObj( p, iVar )->fMark0 )
            Vec_IntPush( vPivots, Abc_Lit2Var(i) );
    Gia_ManForEachObj( p, pObj, i )
        pObj->fMark0 = 0;
    Vec_IntFree( vVars );
    return vPivots;
}